

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall cmm::BinaryOperatorAST::dump(BinaryOperatorAST *this,string *prefix)

{
  ExpressionAST *pEVar1;
  ostream *poVar2;
  string OperatorSymbol;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = 0;
  if (*(uint *)&(this->super_ExpressionAST).field_0xc < 0x14) {
    std::__cxx11::string::assign((char *)&local_38);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_38);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)prefix);
  std::operator<<(poVar2,"|---");
  pEVar1 = (this->LHS)._M_t.
           super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
           super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
           super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
  std::operator+(&bStack_58,prefix,"|   ");
  (*(pEVar1->super_AST)._vptr_AST[2])(pEVar1,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)prefix);
  std::operator<<(poVar2,"`---");
  pEVar1 = (this->RHS)._M_t.
           super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
           super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
           super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
  std::operator+(&bStack_58,prefix,"    ");
  (*(pEVar1->super_AST)._vptr_AST[2])(pEVar1,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void BinaryOperatorAST::dump(const std::string &prefix) const
{
  std::string OperatorSymbol;

  switch (getOpKind()) {
  default: break;
  case Add:           OperatorSymbol = "Add"; break;
  case Minus:         OperatorSymbol = "Sub"; break;
  case Multiply:      OperatorSymbol = "Mul"; break;
  case Division:      OperatorSymbol = "Div"; break;
  case Modulo:        OperatorSymbol = "Mod"; break;
  case LogicalAnd:    OperatorSymbol = "And"; break;
  case LogicalOr:     OperatorSymbol = "Or"; break;
  case Less:          OperatorSymbol = "Less"; break;
  case LessEqual:     OperatorSymbol = "LessEq"; break;
  case Equal:         OperatorSymbol = "Equal"; break;
  case NotEqual:      OperatorSymbol = "NotEq"; break;
  case Greater:       OperatorSymbol = "Greater"; break;
  case BitwiseAnd:    OperatorSymbol = "BitAnd"; break;
  case BitwiseOr:     OperatorSymbol = "BitOr"; break;
  case BitwiseXor:    OperatorSymbol = "Xor"; break;
  case LeftShift:     OperatorSymbol = "LShift"; break;
  case RightShift:    OperatorSymbol = "RShift"; break;
  case Assign:        OperatorSymbol = "Assign"; break;
  case GreaterEqual:  OperatorSymbol = "GreaterEq"; break;
  case Index:         OperatorSymbol = "At"; break;
  }

  std::cout << OperatorSymbol << "\n";

  std::cout << prefix << "|---";
  LHS->dump(prefix + "|   ");

  std::cout << prefix << "`---";
  RHS->dump(prefix + "    ");
}